

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnEventSymbol
          (BinaryReaderObjdumpPrepass *this,Index index,uint32_t flags,string_view name,
          Index event_index)

{
  pointer pOVar1;
  string_view local_60;
  SymbolType local_50;
  string local_48;
  Index local_28;
  
  local_60.size_ = name.size_;
  local_60.data_ = name.data_;
  if (local_60.size_ != 0) {
    ObjdumpNames::Set(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->event_names,
                      event_index,name);
  }
  local_50 = Event;
  string_view::to_string_abi_cxx11_(&local_48,&local_60);
  pOVar1 = (((this->super_BinaryReaderObjdumpBase).objdump_state_)->symtab).
           super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>._M_impl.
           super__Vector_impl_data._M_start + index;
  pOVar1->kind = local_50;
  local_28 = event_index;
  std::__cxx11::string::operator=((string *)&pOVar1->name,(string *)&local_48);
  pOVar1->index = local_28;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return (Result)Ok;
}

Assistant:

Result OnEventSymbol(Index index,
                        uint32_t flags,
                        string_view name,
                        Index event_index) override {
    if (!name.empty()) {
      SetEventName(event_index, name);
    }
    objdump_state_->symtab[index] = {SymbolType::Event, name.to_string(),
                                     event_index};
    return Result::Ok;
  }